

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O2

bool __thiscall
MPEGRawDataHeader::addRawData
          (MPEGRawDataHeader *this,uint8_t *buffer,int len,bool headerIncluded,bool isHeader)

{
  int iVar1;
  int iVar2;
  
  iVar2 = this->m_data_buffer_len + len;
  iVar1 = this->m_max_data_len;
  if (iVar2 <= iVar1) {
    this->m_headerIncludedToBuff = headerIncluded;
    memcpy(this->m_data_buffer + this->m_data_buffer_len,buffer,(long)len);
    this->m_data_buffer_len = this->m_data_buffer_len + len;
  }
  return iVar2 <= iVar1;
}

Assistant:

bool MPEGRawDataHeader::addRawData(uint8_t* buffer, const int len, const bool headerIncluded, bool isHeader)
{
    if (m_data_buffer_len + len > m_max_data_len)
    {
        return false;
    }
    m_headerIncludedToBuff = headerIncluded;
    memcpy(m_data_buffer + m_data_buffer_len, buffer, len);
    m_data_buffer_len += len;
    return true;
}